

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConversion.cpp
# Opt level: O1

bool loopbackTicksToTime(longlong ticks,double rate)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = SoapySDR_ticksToTimeNs();
  lVar2 = SoapySDR_timeNsToTicks(rate,uVar1);
  uVar3 = ticks - lVar2;
  if (uVar3 != 0) {
    uVar4 = -uVar3;
    if (0 < (long)uVar3) {
      uVar4 = uVar3;
    }
    printf("FAIL: loopbackTicksToTime(%lld, %f)\n",rate,ticks);
    printf("    timeNs = %lld, outTicks = %lld\n",uVar1,lVar2);
    printf("    error = %d ticks\n",uVar4 & 0xffffffff);
  }
  return ticks == lVar2;
}

Assistant:

static bool loopbackTicksToTime(const long long ticks, const double rate)
{
    const long long timeNs = SoapySDR::ticksToTimeNs(ticks, rate);
    const long long outTicks = SoapySDR::timeNsToTicks(timeNs, rate);
    if (std::abs(ticks - outTicks) == 0) return true;
    printf("FAIL: loopbackTicksToTime(%lld, %f)\n", ticks, rate);
    printf("    timeNs = %lld, outTicks = %lld\n", timeNs, outTicks);
    printf("    error = %d ticks\n", int(std::abs(ticks - outTicks)));
    return false;
}